

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_PerObjectMeshParameters::Read(ON_PerObjectMeshParameters *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  bool bVar2;
  long lStack_38;
  bool mprc;
  ON__INT64 value;
  uint tcode;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *binary_archive_local;
  ON_PerObjectMeshParameters *this_local;
  
  _minor_version = binary_archive;
  binary_archive_local = (ON_BinaryArchive *)this;
  memcpy(&this->m_mp,&ON_MeshParameters::FastRenderMesh,0xe0);
  ON_MeshParameters::SetCustomSettings(&this->m_mp,true);
  ON_MeshParameters::SetComputeCurvature(&this->m_mp,false);
  iStack_24 = 0;
  tcode = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,(int *)&tcode);
  if (bVar1) {
    value._7_1_ = 0;
    if (iStack_24 == 1) {
      value._0_4_ = 0;
      lStack_38 = 0;
      bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk
                        (_minor_version,(uint *)&value,&stack0xffffffffffffffc8);
      if (bVar1) {
        bVar1 = false;
        if ((((int)value == 0x40008000) && (0 < lStack_38)) &&
           (bVar2 = ON_MeshParameters::Read(&this->m_mp,_minor_version), bVar2)) {
          bVar1 = true;
        }
        bVar2 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
        if ((bVar2) && (bVar1)) {
          value._7_1_ = 1;
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      value._7_1_ = 0;
    }
    ON_MeshParameters::SetCustomSettings(&this->m_mp,true);
    ON_MeshParameters::SetComputeCurvature(&this->m_mp,false);
    this_local._7_1_ = (bool)(value._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PerObjectMeshParameters::Read(ON_BinaryArchive& binary_archive)
{
  m_mp = ON_MeshParameters::FastRenderMesh;
  m_mp.SetCustomSettings(true);
  m_mp.SetComputeCurvature(false);

  int major_version = 0;
  int minor_version = 0;
  if ( !binary_archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version) )
    return false;
    
  bool rc = false;
  for(;;)
  {
    if ( 1 != major_version )
      break;

    unsigned int tcode(0);
    ON__INT64 value(0);
    if (!binary_archive.BeginRead3dmBigChunk(&tcode,&value))
      break;
    bool mprc = false;
    for(;;)
    {
      if (TCODE_ANONYMOUS_CHUNK != tcode )
        break;
      if (value <= 0)
        break;
      if (!m_mp.Read(binary_archive))
        break;
      mprc = true;
      break;
    }
    if (!binary_archive.EndRead3dmChunk())
      break;
    if (!mprc)
      break;

    rc = true;
    break;
  }

  if ( !binary_archive.EndRead3dmChunk() )
    rc = false;

  m_mp.SetCustomSettings(true);
  m_mp.SetComputeCurvature(false);

  return rc;
}